

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3ExprCodeTarget(Parse *pParse,Expr *pExpr,int target)

{
  byte bVar1;
  Table *pTVar2;
  AggInfo *pAVar3;
  VList *pVVar4;
  bool bVar5;
  char cVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  int in2;
  uint uVar10;
  Parse *pPVar11;
  Select *pSVar12;
  CollSeq *pCVar13;
  undefined4 extraout_var;
  long lVar14;
  u8 uVar15;
  u8 uVar16;
  uint uVar17;
  Op *pOVar18;
  size_t __n;
  SrcList **ppSVar19;
  Vdbe *pVVar20;
  char *pcVar21;
  FuncDef *pFVar22;
  int iVar23;
  ExprList *pList;
  ulong uVar24;
  int *piVar25;
  size_t sVar26;
  Expr *pEVar27;
  Expr *pExpr_00;
  ulong uVar28;
  ExprList_item *pEVar29;
  int regFree1;
  Expr *local_118;
  sqlite3 *local_110;
  ulong local_108;
  ulong local_100;
  undefined8 local_f8;
  Vdbe *local_f0;
  int regFree2;
  Select *local_e0;
  int regFree2_1;
  int regFree1_1;
  CollSeq *local_d0;
  Expr opCompare;
  Expr tempX;
  
  pVVar20 = pParse->pVdbe;
  regFree1 = 0;
  regFree2 = 0;
  if (pVVar20 == (Vdbe *)0x0) {
    return 0;
  }
  local_108 = (ulong)(uint)target;
LAB_0016a9b2:
  if (pExpr == (Expr *)0x0) {
    uVar10 = 0x72;
  }
  else {
    uVar10 = (uint)pExpr->op;
  }
  iVar7 = target;
  if (uVar10 < 0x60) {
    switch(uVar10) {
    case 0x13:
      goto switchD_0016a9db_caseD_6b;
    case 0x14:
      goto switchD_0016a9db_caseD_83;
    case 0x15:
    case 0x16:
    case 0x17:
    case 0x18:
    case 0x19:
    case 0x1a:
    case 0x1b:
    case 0x1c:
    case 0x1d:
    case 0x1e:
    case 0x1f:
    case 0x20:
    case 0x21:
    case 0x22:
    case 0x23:
    case 0x25:
    case 0x26:
    case 0x27:
    case 0x28:
    case 0x29:
    case 0x2a:
    case 0x2e:
    case 0x2f:
      goto switchD_0016a9db_caseD_6c;
    case 0x24:
      iVar7 = sqlite3ExprCodeTarget(pParse,pExpr->pLeft,target);
      if (iVar7 != target) {
        sqlite3VdbeAddOp3(pVVar20,0x4f,iVar7,target,0);
        iVar7 = target;
      }
      cVar6 = sqlite3AffinityType((pExpr->u).zToken,(Column *)0x0);
      sqlite3VdbeAddOp3(pVVar20,0x55,target,(int)cVar6,0);
      return iVar7;
    case 0x2b:
    case 0x2c:
      goto switchD_0016a9db_caseD_60;
    case 0x2d:
      goto switchD_0016a9db_caseD_a0;
    case 0x30:
      exprCodeBetween(pParse,pExpr,target,(_func_void_Parse_ptr_Expr_ptr_int_int *)0x0,0);
      return target;
    case 0x31:
      iVar7 = pParse->nLabel + -1;
      iVar8 = pParse->nLabel + -2;
      pParse->nLabel = iVar8;
      sqlite3VdbeAddOp3(pVVar20,0x49,0,target,0);
      sqlite3ExprCodeIN(pParse,pExpr,iVar7,iVar8);
      sqlite3VdbeAddOp3(pVVar20,0x46,1,target,0);
      sqlite3VdbeResolveLabel(pVVar20,iVar7);
      sqlite3VdbeAddOp3(pVVar20,0x53,target,0,0);
      sqlite3VdbeResolveLabel(pVVar20,iVar8);
      return target;
    case 0x32:
    case 0x33:
      sqlite3VdbeAddOp3(pVVar20,0x46,1,target,0);
      iVar7 = sqlite3ExprCodeTemp(pParse,pExpr->pLeft,&regFree1);
      iVar7 = sqlite3VdbeAddOp3(pVVar20,uVar10,iVar7,0,0);
      sqlite3VdbeAddOp3(pVVar20,0x46,0,target,0);
      if (pVVar20->db->mallocFailed == '\0') {
        iVar8 = pVVar20->nOp + -1;
        if (-1 < iVar7) {
          iVar8 = iVar7;
        }
        pOVar18 = pVVar20->aOp + iVar8;
      }
      else {
        pOVar18 = (Op *)&sqlite3VdbeGetOp_dummy;
      }
      pOVar18->p2 = pVVar20->nOp;
      goto LAB_0016b813;
    case 0x34:
    case 0x35:
    case 0x36:
    case 0x37:
    case 0x38:
    case 0x39:
      uVar9 = 0;
      goto LAB_0016ab69;
    default:
      if (uVar10 == 0x47) {
        if (pParse->pTriggerTab == (Table *)0x0) {
          sqlite3ErrorMsg(pParse,"RAISE() may only be used within a trigger-program");
          return 0;
        }
        cVar6 = pExpr->affinity;
        if (cVar6 == '\x04') {
          pcVar21 = (pExpr->u).zToken;
          iVar7 = sqlite3VdbeAddOp3(pVVar20,0x45,0,4,0);
          sqlite3VdbeChangeP4(pVVar20,iVar7,pcVar21,0);
        }
        else {
          if (cVar6 == '\x02') {
            pPVar11 = pParse->pToplevel;
            if (pParse->pToplevel == (Parse *)0x0) {
              pPVar11 = pParse;
            }
            pPVar11->mayAbort = '\x01';
          }
          sqlite3HaltConstraint(pParse,0x713,(int)cVar6,(pExpr->u).zToken,'\0','\0');
        }
        goto LAB_0016b813;
      }
      if (uVar10 != 0x4d) goto switchD_0016a9db_caseD_6c;
      pTVar2 = (pExpr->y).pTab;
      sqlite3VdbeAddOp3(pVVar20,0x95,(int)pExpr->iColumn + (pTVar2->nCol + 1) * pExpr->iTable + 1,
                        target,0);
      if (((long)pExpr->iColumn < 0) || (pTVar2->aCol[pExpr->iColumn].affinity != 'E'))
      goto LAB_0016b813;
      uVar10 = 0x54;
      iVar8 = target;
      iVar23 = 0;
LAB_0016ab4b:
      iVar7 = 0;
      goto LAB_0016aa3e;
    }
  }
  switch(uVar10) {
  case 0x60:
  case 0x61:
  case 0x62:
  case 99:
  case 100:
  case 0x65:
  case 0x66:
  case 0x67:
  case 0x68:
  case 0x69:
    goto switchD_0016a9db_caseD_60;
  case 0x6a:
  case 0xa6:
  case 0xad:
    goto switchD_0016a9db_caseD_6a;
  case 0x6b:
switchD_0016a9db_caseD_6b:
    iVar8 = sqlite3ExprCodeTemp(pParse,pExpr->pLeft,&regFree1);
    iVar23 = target;
    goto LAB_0016ab4b;
  default:
switchD_0016a9db_caseD_6c:
    local_e0 = (pExpr->x).pSelect;
    local_f8 = (ulong)*(int *)&local_e0->pEList;
    iVar7 = pParse->nLabel + -1;
    pParse->nLabel = iVar7;
    local_118 = pExpr->pLeft;
    if (local_118 == (Expr *)0x0) {
      pEVar27 = (Expr *)0x0;
      local_f0 = pVVar20;
    }
    else {
      tempX.iColumn = 0;
      tempX.iAgg = 0;
      tempX.iRightJoinTable = 0;
      tempX.op2 = '\0';
      tempX._55_1_ = 0;
      tempX.pAggInfo = (AggInfo *)0x0;
      tempX.x.pList = (ExprList *)0x0;
      tempX.nHeight = 0;
      tempX.iTable = 0;
      tempX.pLeft = (Expr *)0x0;
      tempX.pRight = (Expr *)0x0;
      tempX.op = '\0';
      tempX.affinity = '\0';
      tempX._2_2_ = 0;
      tempX.flags._0_1_ = 0;
      tempX.flags._1_1_ = 0;
      tempX.flags._2_2_ = 0;
      tempX.u.iValue = 0;
      tempX.u._4_4_ = 0;
      tempX.y.pTab = (Table *)0x0;
      sVar26 = 0x2c;
      if ((local_118->flags >> 0xd & 1) == 0) {
        sVar26 = 0x48;
      }
      __n = 0x10;
      if ((local_118->flags >> 0xe & 1) == 0) {
        __n = sVar26;
      }
      local_f0 = pVVar20;
      memcpy(&tempX,local_118,__n);
      iVar8 = exprCodeVector(pParse,&tempX,&regFree1);
      tempX.op2 = tempX.op;
      tempX.op = 0xa8;
      tempX.iTable = iVar8;
      tempX.flags._1_1_ = tempX.flags._1_1_ & 0xef;
      pEVar27 = &opCompare;
      opCompare.u.zToken = (char *)0x0;
      opCompare.pRight = (Expr *)0x0;
      opCompare.x.pList = (ExprList *)0x0;
      opCompare.nHeight = 0;
      opCompare.iTable = 0;
      opCompare.iColumn = 0;
      opCompare.iAgg = 0;
      opCompare.iRightJoinTable = 0;
      opCompare.op2 = '\0';
      opCompare._55_1_ = 0;
      opCompare.pAggInfo = (AggInfo *)0x0;
      opCompare.y.pTab = (Table *)0x0;
      opCompare.op = '5';
      opCompare.affinity = '\0';
      opCompare._2_2_ = 0;
      opCompare.flags = 0;
      opCompare.pLeft = &tempX;
    }
    pVVar20 = local_f0;
    regFree1 = 0;
    local_110 = (sqlite3 *)(local_f8 - 1);
    if (1 < (int)local_f8) {
      ppSVar19 = &local_e0->pSrc;
      iVar8 = 0;
      do {
        pExpr_00 = (Expr *)ppSVar19[-4];
        if (local_118 != (Expr *)0x0) {
          pExpr_00 = pEVar27;
          opCompare.pRight = (Expr *)ppSVar19[-4];
        }
        iVar23 = pParse->nLabel + -1;
        pParse->nLabel = iVar23;
        sqlite3ExprIfFalse(pParse,pExpr_00,iVar23,0x10);
        sqlite3ExprCode(pParse,(Expr *)*ppSVar19,(int)local_108);
        sqlite3VdbeAddOp3(pVVar20,0xb,0,iVar7,0);
        sqlite3VdbeResolveLabel(pVVar20,iVar23);
        ppSVar19 = ppSVar19 + 8;
        iVar8 = iVar8 + 2;
        pEVar27 = pExpr_00;
      } while (iVar8 < (int)local_110);
    }
    pVVar20 = local_f0;
    target = (int)local_108;
    if ((local_f8 & 1) == 0) {
      sqlite3VdbeAddOp3(local_f0,0x49,0,target,0);
    }
    else {
      sqlite3ExprCode(pParse,*(Expr **)(local_e0->addrOpenEphm + (long)local_110 * 8 + -5),target);
      pVVar20 = local_f0;
    }
    sqlite3VdbeResolveLabel(pVVar20,iVar7);
    goto LAB_0016b813;
  case 0x6e:
    sqlite3VdbeLoadString(pVVar20,target,(pExpr->u).zToken);
    return target;
  case 0x72:
    iVar7 = 0x49;
    uVar10 = 0;
    goto LAB_0016afc5;
  case 0x83:
switchD_0016a9db_caseD_83:
    if ((uVar10 == 0x83) && (uVar10 = ((pExpr->x).pSelect)->pEList->nExpr, uVar10 != 1)) {
      sqlite3ErrorMsg(pParse,"sub-select returns %d columns - expected %d",(ulong)uVar10,1);
      iVar7 = 0x83;
      goto LAB_0016b80d;
    }
    iVar7 = sqlite3CodeSubselect(pParse,pExpr);
    break;
  case 0x91:
    pcVar21 = (pExpr->u).zToken;
    iVar7 = 0;
    goto LAB_0016b5e7;
  case 0x92:
    pcVar21 = (pExpr->u).zToken;
    sVar26 = strlen(pcVar21 + 2);
    uVar10 = (uint)sVar26 & 0x3fffffff;
    iVar7 = uVar10 - 1;
    pcVar21 = (char *)sqlite3HexToBlob(pVVar20->db,pcVar21 + 2,iVar7);
    iVar7 = sqlite3VdbeAddOp3(pVVar20,0x4b,(int)((uVar10 - (iVar7 >> 0x1f)) + -1) >> 1,target,0);
    iVar8 = -7;
    goto LAB_0016b788;
  case 0x93:
    iVar7 = 0;
LAB_0016b095:
    codeInteger(pParse,pExpr,iVar7,target);
    return target;
  case 0x94:
    sqlite3VdbeAddOp3(pVVar20,0x4c,(int)pExpr->iColumn,target,0);
    if ((pExpr->u).zToken[1] == '\0') {
      return target;
    }
    pVVar4 = pParse->pVList;
    if (pVVar4 == (VList *)0x0) goto LAB_0016aeca;
    iVar7 = 2;
    goto LAB_0016aeb4;
  case 0x9f:
    uVar10 = (uint)((pExpr->u).zToken[4] == '\0');
    iVar7 = 0x46;
LAB_0016afc5:
    sqlite3VdbeAddOp3(pVVar20,iVar7,uVar10,target,0);
    return target;
  case 0xa0:
switchD_0016a9db_caseD_a0:
    uVar10 = uVar10 == 0x2d | 0x34;
    uVar9 = 0x80;
LAB_0016ab69:
    pEVar27 = pExpr->pLeft;
    uVar16 = pEVar27->op;
    uVar15 = uVar16;
    if (uVar16 == 0xa8) {
      uVar15 = pEVar27->op2;
    }
    local_110 = (sqlite3 *)pEVar27;
    if (uVar15 == 0x83) {
      pSVar12 = (pEVar27->x).pSelect;
LAB_0016aba7:
      if (1 < ((anon_union_8_2_a01b6dbf_for_x *)&pSVar12->pEList)->pList->nExpr) {
        uVar15 = uVar16;
        if (uVar16 == 0xa8) {
          uVar15 = pEVar27->op2;
        }
        local_118 = pExpr->pRight;
        if (uVar15 == 0x83) {
          pSVar12 = (pEVar27->x).pSelect;
LAB_0016b1e5:
          iVar7 = ((anon_union_8_2_a01b6dbf_for_x *)&pSVar12->pEList)->pList->nExpr;
        }
        else {
          iVar7 = 1;
          if (uVar15 == 0xa9) {
            pSVar12 = (Select *)&pEVar27->x;
            goto LAB_0016b1e5;
          }
        }
        iVar8 = pParse->nLabel + -1;
        local_100 = CONCAT44(local_100._4_4_,iVar8);
        pParse->nLabel = iVar8;
        uVar15 = local_118->op;
        if (uVar15 == 0xa8) {
          uVar15 = local_118->op2;
        }
        if (uVar15 == 0x83) {
          pSVar12 = (local_118->x).pSelect;
LAB_0016b235:
          iVar8 = ((anon_union_8_2_a01b6dbf_for_x *)&pSVar12->pEList)->pList->nExpr;
        }
        else {
          iVar8 = 1;
          if (uVar15 == 0xa9) {
            pSVar12 = (Select *)&local_118->x;
            goto LAB_0016b235;
          }
        }
        local_f0 = pVVar20;
        if (iVar7 != iVar8) goto switchD_0016a9db_caseD_a9;
        local_d0 = (CollSeq *)CONCAT44(local_d0._4_4_,uVar10);
        uVar17 = 0x38;
        if (uVar10 != 0x37) {
          uVar17 = uVar10;
        }
        uVar10 = 0x36;
        if ((char)uVar17 != '9') {
          uVar10 = uVar17;
        }
        local_f8 = local_f8 & 0xffffffff00000000;
        local_e0 = (Select *)((ulong)local_e0 & 0xffffffff00000000);
        if (uVar16 == 0x83) {
          iVar8 = sqlite3CodeSubselect(pParse,pEVar27);
          local_e0 = (Select *)CONCAT44(local_e0._4_4_,iVar8);
        }
        if (local_118->op == 0x83) {
          iVar8 = sqlite3CodeSubselect(pParse,local_118);
          local_f8 = CONCAT44(local_f8._4_4_,iVar8);
        }
        uVar9 = uVar9 | 0x20;
        iVar8 = 0;
        goto LAB_0016b2b5;
      }
    }
    else if (uVar15 == 0xa9) {
      pSVar12 = (Select *)&pEVar27->x;
      goto LAB_0016aba7;
    }
    iVar7 = sqlite3ExprCodeTemp(pParse,pEVar27,&regFree1);
    iVar8 = sqlite3ExprCodeTemp(pParse,pExpr->pRight,&regFree2);
    codeCompare(pParse,pEVar27,pExpr->pRight,uVar10,iVar7,iVar8,target,uVar9 | 0x20);
    goto LAB_0016b813;
  case 0xa1:
    if ((pExpr->flags & 0x1000000) == 0) {
      local_110 = pParse->db;
      bVar1 = local_110->enc;
      if ((pParse->okConstFactor == '\0') ||
         (iVar7 = sqlite3ExprIsConstantNotJoin(pExpr), iVar7 == 0)) {
        local_118 = (Expr *)0x0;
        if ((pExpr->flags & 0x4000) == 0) {
          pList = (pExpr->x).pList;
        }
        else {
          pList = (ExprList *)0x0;
        }
        if (pList != (ExprList *)0x0) {
          local_118 = (Expr *)(ulong)(uint)pList->nExpr;
        }
        pcVar21 = (pExpr->u).zToken;
        local_f0 = pVVar20;
        pSVar12 = (Select *)sqlite3FindFunction(local_110,pcVar21,(int)local_118,bVar1,'\0');
        pFVar22 = (FuncDef *)(ulong)bVar1;
        if ((pSVar12 == (Select *)0x0) ||
           (pFVar22 = (FuncDef *)pSVar12,
           ((FuncDef *)pSVar12)->xFinalize != (_func_void_sqlite3_context_ptr *)0x0)) {
          iVar7 = (int)pFVar22;
          sqlite3ErrorMsg(pParse,"unknown function: %s()",pcVar21);
          goto LAB_0016b80d;
        }
        if ((((FuncDef *)pSVar12)->funcFlags >> 9 & 1) == 0) {
          if ((((FuncDef *)pSVar12)->funcFlags >> 10 & 1) != 0) {
            iVar7 = sqlite3ExprCodeTarget(pParse,pList->a[0].pExpr,target);
            break;
          }
          local_100 = 0;
          if ((int)local_118 < 1) {
            pCVar13 = (CollSeq *)0x0;
            local_f8 = (ulong)local_f8._4_4_ << 0x20;
          }
          else {
            pEVar29 = pList->a;
            uVar24 = (ulong)local_118 & 0xffffffff;
            uVar28 = 0;
            local_f8 = (ulong)local_f8._4_4_ << 0x20;
            pCVar13 = (CollSeq *)0x0;
            local_e0 = pSVar12;
            do {
              if ((uVar28 < 0x20) &&
                 (iVar7 = sqlite3ExprIsConstant(pEVar29->pExpr), pSVar12 = local_e0, iVar7 != 0)) {
                local_f8 = CONCAT44(local_f8._4_4_,(uint)local_f8 | 1 << ((uint)uVar28 & 0x1f));
              }
              if (((((FuncDef *)pSVar12)->funcFlags & 0x20) != 0) && (pCVar13 == (CollSeq *)0x0)) {
                pCVar13 = sqlite3ExprCollSeq(pParse,pEVar29->pExpr);
              }
              uVar28 = uVar28 + 1;
              pEVar29 = pEVar29 + 1;
            } while (uVar24 != uVar28);
          }
          iVar7 = (int)local_108;
          iVar8 = (int)local_118;
          local_d0 = pCVar13;
          if (pList != (ExprList *)0x0) {
            if ((uint)local_f8 == 0) {
              iVar23 = sqlite3GetTempRange(pParse,iVar8);
              local_100 = CONCAT44(extraout_var,iVar23);
            }
            else {
              local_100 = (ulong)(pParse->nMem + 1);
              pParse->nMem = pParse->nMem + iVar8;
            }
            uVar10 = ((FuncDef *)pSVar12)->funcFlags & 0xc0;
            if (uVar10 != 0) {
              pEVar27 = pList->a[0].pExpr;
              uVar16 = pEVar27->op;
              if ((uVar16 == 0xa4) || (uVar16 == 0xa2)) {
                pEVar27->op2 = (u8)uVar10;
              }
            }
            sqlite3ExprCodeExprList(pParse,pList,(int)local_100,0,'\x03');
          }
          if (((1 < iVar8) && (lVar14 = 0x28, (pExpr->flags & 0x80) != 0)) ||
             (lVar14 = 8, 0 < iVar8)) {
            pSVar12 = (Select *)
                      sqlite3VtabOverloadFunction
                                (local_110,(FuncDef *)pSVar12,iVar8,
                                 *(Expr **)((long)pList->a + lVar14 + -8));
          }
          pVVar20 = local_f0;
          iVar8 = (uint)local_f8;
          if ((((FuncDef *)pSVar12)->funcFlags & 0x20) != 0) {
            pCVar13 = local_d0;
            if (local_d0 == (CollSeq *)0x0) {
              pCVar13 = local_110->pDfltColl;
            }
            iVar23 = sqlite3VdbeAddOp3(local_f0,0x52,0,0,0);
            sqlite3VdbeChangeP4(pVVar20,iVar23,(char *)pCVar13,-2);
          }
          iVar23 = sqlite3VdbeAddOp3(pVVar20,(pParse->iSelfTab == 0) + 0x3e,iVar8,(int)local_100,
                                     iVar7);
          sqlite3VdbeChangeP4(pVVar20,iVar23,(char *)pSVar12,-8);
          if (0 < (long)pVVar20->nOp) {
            pVVar20->aOp[(long)pVVar20->nOp + -1].p5 = (ushort)(byte)local_118;
          }
          bVar5 = false;
          iVar23 = (int)local_118;
          if (iVar23 != 0) {
            target = iVar7;
            if (iVar8 != 0) goto LAB_0016b80f;
            if (iVar23 == 1) {
              if ((int)local_100 != 0) {
                bVar1 = pParse->nTempReg;
                if ((ulong)bVar1 < 8) {
                  pParse->nTempReg = bVar1 + 1;
                  pParse->aTempReg[bVar1] = (int)local_100;
                }
              }
            }
            else if (pParse->nRangeReg < iVar23) {
              pParse->nRangeReg = iVar23;
              pParse->iRangeReg = (int)local_100;
            }
            iVar7 = (int)local_108;
          }
          bVar5 = false;
          target = iVar7;
        }
        else {
          iVar7 = pParse->nLabel + -1;
          pParse->nLabel = iVar7;
          sqlite3ExprCode(pParse,pList->a[0].pExpr,target);
          pVVar20 = local_f0;
          if (1 < (int)local_118) {
            uVar24 = (ulong)local_118 & 0xffffffff;
            lVar14 = 0;
            do {
              sqlite3VdbeAddOp3(pVVar20,0x33,target,iVar7,0);
              sqlite3ExprCode(pParse,*(Expr **)((long)pList[1].a + lVar14 + -8),target);
              lVar14 = lVar14 + 0x20;
            } while (uVar24 * 0x20 + -0x20 != lVar14);
          }
          sqlite3VdbeResolveLabel(pVVar20,iVar7);
LAB_0016b80d:
          bVar5 = true;
        }
LAB_0016b80f:
        if (!bVar5) {
          return iVar7;
        }
        goto LAB_0016b813;
      }
      iVar7 = sqlite3ExprCodeAtInit(pParse,pExpr,-1);
    }
    else {
      iVar7 = ((pExpr->y).pWin)->regResult;
    }
    break;
  case 0xa2:
    goto switchD_0016a9db_caseD_a2;
  case 0xa3:
    if (pExpr->pAggInfo != (AggInfo *)0x0) {
      return pExpr->pAggInfo->aFunc[pExpr->iAgg].iMem;
    }
    sqlite3ErrorMsg(pParse,"misuse of aggregate: %s()",(pExpr->u).zToken);
    goto LAB_0016b813;
  case 0xa4:
    pAVar3 = pExpr->pAggInfo;
    if (pAVar3->directMode == '\0') {
      uVar10 = pAVar3->aCol[pExpr->iAgg].iMem;
      bVar5 = false;
    }
    else if (pAVar3->useSortingIdx == '\0') {
      bVar5 = true;
    }
    else {
      sqlite3VdbeAddOp3(pVVar20,0x5a,pAVar3->sortingIdxPTab,pAVar3->aCol[pExpr->iAgg].iSorterColumn,
                        target);
      bVar5 = false;
      uVar10 = target;
    }
    if (!bVar5) {
      return uVar10;
    }
switchD_0016a9db_caseD_a2:
    if ((pExpr->flags & 8) == 0) {
      iVar7 = pExpr->iTable;
      if (iVar7 < 0) {
        iVar7 = pParse->iSelfTab;
        if (iVar7 < 0) {
          return pExpr->iColumn - iVar7;
        }
        iVar7 = iVar7 + -1;
      }
      sqlite3ExprCodeGetColumn(pParse,(pExpr->y).pTab,(int)pExpr->iColumn,iVar7,target,pExpr->op2);
      return target;
    }
    iVar7 = sqlite3ExprCodeTarget(pParse,pExpr->pLeft,target);
    if ((long)pExpr->iColumn < 0) {
      cVar6 = 'D';
    }
    else {
      cVar6 = ((pExpr->y).pTab)->aCol[pExpr->iColumn].affinity;
    }
    if (cVar6 == 'A') {
      return iVar7;
    }
    if (iVar7 != target) {
      sqlite3VdbeAddOp3(pVVar20,0x4f,iVar7,target,0);
      iVar7 = target;
    }
    target = iVar7;
    pcVar21 = (char *)((long)yyRuleInfoLhs + (long)(cVar6 * 2) + 0x29c);
    iVar7 = sqlite3VdbeAddOp3(pVVar20,0x5b,target,1,0);
    iVar8 = -1;
LAB_0016b788:
    sqlite3VdbeChangeP4(pVVar20,iVar7,pcVar21,iVar8);
    return target;
  case 0xa5:
    pEVar27 = pExpr->pLeft;
    if (pEVar27->op == 0x91) {
      pcVar21 = (pEVar27->u).zToken;
      iVar7 = 1;
LAB_0016b5e7:
      codeReal(pVVar20,pcVar21,iVar7,target);
      return target;
    }
    if (pEVar27->op == 0x93) {
      iVar7 = 1;
      pExpr = pEVar27;
      goto LAB_0016b095;
    }
    tempX.op = 0x93;
    tempX.flags._0_1_ = 0;
    tempX.flags._1_1_ = 0x44;
    tempX.flags._2_2_ = 0;
    tempX.u.iValue = 0;
    iVar23 = sqlite3ExprCodeTemp(pParse,&tempX,&regFree1);
    iVar8 = sqlite3ExprCodeTemp(pParse,pExpr->pLeft,&regFree2);
    uVar10 = 0x65;
    goto LAB_0016aa3e;
  case 0xa7:
    iVar7 = sqlite3ExprCodeTemp(pParse,pExpr->pLeft,&regFree1);
    cVar6 = (pExpr->pRight->u).zToken[4];
    uVar16 = pExpr->op2;
    iVar7 = sqlite3VdbeAddOp3(pVVar20,0x58,iVar7,target,(uint)(cVar6 != '\0'));
    if (pVVar20->db->mallocFailed == '\0') {
      pOVar18 = pVVar20->aOp;
      pOVar18[iVar7].p4type = -3;
      *(uint *)&pOVar18[iVar7].p4 = (uint)((uVar16 == '-') != (cVar6 == '\0'));
    }
    goto LAB_0016b813;
  case 0xa8:
    return pExpr->iTable;
  case 0xa9:
switchD_0016a9db_caseD_a9:
    sqlite3ErrorMsg(pParse,"row value misused");
    goto LAB_0016b813;
  case 0xaa:
    if (pExpr->pLeft->iTable == 0) {
      iVar7 = sqlite3CodeSubselect(pParse,pExpr->pLeft);
      pExpr->pLeft->iTable = iVar7;
    }
    if (pExpr->iTable == 0) goto LAB_0016b708;
    pEVar27 = pExpr->pLeft;
    uVar16 = pEVar27->op;
    if (uVar16 == 0xa8) {
      uVar16 = pEVar27->op2;
    }
    if (uVar16 == 0x83) {
      pSVar12 = (pEVar27->x).pSelect;
LAB_0016b6ee:
      iVar7 = ((anon_union_8_2_a01b6dbf_for_x *)&pSVar12->pEList)->pList->nExpr;
    }
    else {
      iVar7 = 1;
      if (uVar16 == 0xa9) {
        pSVar12 = (Select *)&pEVar27->x;
        goto LAB_0016b6ee;
      }
    }
    if (pExpr->iTable != iVar7) {
      sqlite3ErrorMsg(pParse,"%d columns assigned %d values");
    }
LAB_0016b708:
    return (int)pExpr->iColumn + pExpr->pLeft->iTable;
  case 0xab:
    iVar8 = sqlite3VdbeAddOp3(pVVar20,0x15,pExpr->iTable,0,0);
    target = sqlite3ExprCodeTarget(pParse,pExpr->pLeft,target);
    iVar7 = pVVar20->nOp;
    if (pVVar20->db->mallocFailed == '\0') {
      iVar23 = iVar7 + -1;
      if (-1 < iVar8) {
        iVar23 = iVar8;
      }
      pVVar20->aOp[iVar23].p2 = iVar7;
      pOVar18 = pVVar20->aOp + iVar23;
    }
    else {
      pOVar18 = (Op *)&sqlite3VdbeGetOp_dummy;
      DAT_00210a80 = iVar7;
    }
    pOVar18->p3 = target;
    goto LAB_0016b813;
  }
  bVar5 = false;
  goto LAB_0016b80f;
switchD_0016a9db_caseD_6a:
  pExpr = pExpr->pLeft;
  goto LAB_0016a9b2;
switchD_0016a9db_caseD_60:
  iVar23 = sqlite3ExprCodeTemp(pParse,pExpr->pLeft,&regFree1);
  iVar8 = sqlite3ExprCodeTemp(pParse,pExpr->pRight,&regFree2);
LAB_0016aa3e:
  sqlite3VdbeAddOp3(pVVar20,uVar10,iVar8,iVar23,iVar7);
  goto LAB_0016b813;
  while (iVar7 = iVar7 + piVar25[1], iVar7 < pVVar4[1]) {
LAB_0016aeb4:
    piVar25 = pVVar4 + iVar7;
    if (*piVar25 == (int)pExpr->iColumn) {
      piVar25 = piVar25 + 2;
      goto LAB_0016b71f;
    }
  }
LAB_0016aeca:
  piVar25 = (int *)0x0;
LAB_0016b71f:
  *pVVar4 = 0;
  sqlite3VdbeAppendP4(pVVar20,piVar25,-1);
  return target;
LAB_0016b2b5:
  do {
    regFree1_1 = 0;
    regFree2_1 = 0;
    iVar23 = exprVectorRegister(pParse,(Expr *)local_110,iVar8,(int)local_e0,(Expr **)&tempX,
                                &regFree1_1);
    in2 = exprVectorRegister(pParse,local_118,iVar8,(uint)local_f8,(Expr **)&opCompare,&regFree2_1);
    uVar17 = uVar10 & 0xff;
    codeCompare(pParse,(Expr *)CONCAT26(tempX.flags._2_2_,
                                        CONCAT15(tempX.flags._1_1_,
                                                 CONCAT14((undefined1)tempX.flags,tempX._0_4_))),
                (Expr *)opCompare._0_8_,uVar17,iVar23,in2,(int)local_108,uVar9);
    if (regFree1_1 != 0) {
      bVar1 = pParse->nTempReg;
      if ((ulong)bVar1 < 8) {
        pParse->nTempReg = bVar1 + 1;
        pParse->aTempReg[bVar1] = regFree1_1;
      }
    }
    if (regFree2_1 != 0) {
      bVar1 = pParse->nTempReg;
      if ((ulong)bVar1 < 8) {
        pParse->nTempReg = bVar1 + 1;
        pParse->aTempReg[bVar1] = regFree2_1;
      }
    }
    if (iVar8 - iVar7 != -1) {
      if ((char)uVar10 == '4') {
        iVar23 = 0x12;
      }
      else {
        if (uVar17 != 0x35) {
          sqlite3VdbeAddOp3(local_f0,0x3a,0,(int)local_100,0);
          uVar10 = uVar17;
          if (iVar8 - iVar7 == -2) {
            uVar10 = (uint)local_d0;
          }
          goto LAB_0016b3e1;
        }
        iVar23 = 0x14;
      }
      sqlite3VdbeAddOp3(local_f0,iVar23,(int)local_108,(int)local_100,0);
      uVar9 = uVar9 | 8;
    }
LAB_0016b3e1:
    iVar8 = iVar8 + 1;
  } while (iVar8 != iVar7);
  sqlite3VdbeResolveLabel(local_f0,(int)local_100);
  target = (int)local_108;
LAB_0016b813:
  if (regFree1 != 0) {
    bVar1 = pParse->nTempReg;
    if ((ulong)bVar1 < 8) {
      pParse->nTempReg = bVar1 + 1;
      pParse->aTempReg[bVar1] = regFree1;
    }
  }
  if (regFree2 != 0) {
    bVar1 = pParse->nTempReg;
    if ((ulong)bVar1 < 8) {
      pParse->nTempReg = bVar1 + 1;
      pParse->aTempReg[bVar1] = regFree2;
    }
  }
  return target;
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprCodeTarget(Parse *pParse, Expr *pExpr, int target){
  Vdbe *v = pParse->pVdbe;  /* The VM under construction */
  int op;                   /* The opcode being coded */
  int inReg = target;       /* Results stored in register inReg */
  int regFree1 = 0;         /* If non-zero free this temporary register */
  int regFree2 = 0;         /* If non-zero free this temporary register */
  int r1, r2;               /* Various register numbers */
  Expr tempX;               /* Temporary expression node */
  int p5 = 0;

  assert( target>0 && target<=pParse->nMem );
  if( v==0 ){
    assert( pParse->db->mallocFailed );
    return 0;
  }

expr_code_doover:
  if( pExpr==0 ){
    op = TK_NULL;
  }else{
    op = pExpr->op;
  }
  switch( op ){
    case TK_AGG_COLUMN: {
      AggInfo *pAggInfo = pExpr->pAggInfo;
      struct AggInfo_col *pCol = &pAggInfo->aCol[pExpr->iAgg];
      if( !pAggInfo->directMode ){
        assert( pCol->iMem>0 );
        return pCol->iMem;
      }else if( pAggInfo->useSortingIdx ){
        sqlite3VdbeAddOp3(v, OP_Column, pAggInfo->sortingIdxPTab,
                              pCol->iSorterColumn, target);
        return target;
      }
      /* Otherwise, fall thru into the TK_COLUMN case */
    }
    case TK_COLUMN: {
      int iTab = pExpr->iTable;
      if( ExprHasProperty(pExpr, EP_FixedCol) ){
        /* This COLUMN expression is really a constant due to WHERE clause
        ** constraints, and that constant is coded by the pExpr->pLeft
        ** expresssion.  However, make sure the constant has the correct
        ** datatype by applying the Affinity of the table column to the
        ** constant.
        */
        int iReg = sqlite3ExprCodeTarget(pParse, pExpr->pLeft,target);
        int aff = sqlite3TableColumnAffinity(pExpr->y.pTab, pExpr->iColumn);
        if( aff!=SQLITE_AFF_BLOB ){
          static const char zAff[] = "B\000C\000D\000E";
          assert( SQLITE_AFF_BLOB=='A' );
          assert( SQLITE_AFF_TEXT=='B' );
          if( iReg!=target ){
            sqlite3VdbeAddOp2(v, OP_SCopy, iReg, target);
            iReg = target;
          }
          sqlite3VdbeAddOp4(v, OP_Affinity, iReg, 1, 0,
                            &zAff[(aff-'B')*2], P4_STATIC);
        }
        return iReg;
      }
      if( iTab<0 ){
        if( pParse->iSelfTab<0 ){
          /* Generating CHECK constraints or inserting into partial index */
          return pExpr->iColumn - pParse->iSelfTab;
        }else{
          /* Coding an expression that is part of an index where column names
          ** in the index refer to the table to which the index belongs */
          iTab = pParse->iSelfTab - 1;
        }
      }
      return sqlite3ExprCodeGetColumn(pParse, pExpr->y.pTab,
                               pExpr->iColumn, iTab, target,
                               pExpr->op2);
    }
    case TK_INTEGER: {
      codeInteger(pParse, pExpr, 0, target);
      return target;
    }
    case TK_TRUEFALSE: {
      sqlite3VdbeAddOp2(v, OP_Integer, sqlite3ExprTruthValue(pExpr), target);
      return target;
    }
#ifndef SQLITE_OMIT_FLOATING_POINT
    case TK_FLOAT: {
      assert( !ExprHasProperty(pExpr, EP_IntValue) );
      codeReal(v, pExpr->u.zToken, 0, target);
      return target;
    }
#endif
    case TK_STRING: {
      assert( !ExprHasProperty(pExpr, EP_IntValue) );
      sqlite3VdbeLoadString(v, target, pExpr->u.zToken);
      return target;
    }
    case TK_NULL: {
      sqlite3VdbeAddOp2(v, OP_Null, 0, target);
      return target;
    }
#ifndef SQLITE_OMIT_BLOB_LITERAL
    case TK_BLOB: {
      int n;
      const char *z;
      char *zBlob;
      assert( !ExprHasProperty(pExpr, EP_IntValue) );
      assert( pExpr->u.zToken[0]=='x' || pExpr->u.zToken[0]=='X' );
      assert( pExpr->u.zToken[1]=='\'' );
      z = &pExpr->u.zToken[2];
      n = sqlite3Strlen30(z) - 1;
      assert( z[n]=='\'' );
      zBlob = sqlite3HexToBlob(sqlite3VdbeDb(v), z, n);
      sqlite3VdbeAddOp4(v, OP_Blob, n/2, target, 0, zBlob, P4_DYNAMIC);
      return target;
    }
#endif
    case TK_VARIABLE: {
      assert( !ExprHasProperty(pExpr, EP_IntValue) );
      assert( pExpr->u.zToken!=0 );
      assert( pExpr->u.zToken[0]!=0 );
      sqlite3VdbeAddOp2(v, OP_Variable, pExpr->iColumn, target);
      if( pExpr->u.zToken[1]!=0 ){
        const char *z = sqlite3VListNumToName(pParse->pVList, pExpr->iColumn);
        assert( pExpr->u.zToken[0]=='?' || strcmp(pExpr->u.zToken, z)==0 );
        pParse->pVList[0] = 0; /* Indicate VList may no longer be enlarged */
        sqlite3VdbeAppendP4(v, (char*)z, P4_STATIC);
      }
      return target;
    }
    case TK_REGISTER: {
      return pExpr->iTable;
    }
#ifndef SQLITE_OMIT_CAST
    case TK_CAST: {
      /* Expressions of the form:   CAST(pLeft AS token) */
      inReg = sqlite3ExprCodeTarget(pParse, pExpr->pLeft, target);
      if( inReg!=target ){
        sqlite3VdbeAddOp2(v, OP_SCopy, inReg, target);
        inReg = target;
      }
      sqlite3VdbeAddOp2(v, OP_Cast, target,
                        sqlite3AffinityType(pExpr->u.zToken, 0));
      return inReg;
    }
#endif /* SQLITE_OMIT_CAST */
    case TK_IS:
    case TK_ISNOT:
      op = (op==TK_IS) ? TK_EQ : TK_NE;
      p5 = SQLITE_NULLEQ;
      /* fall-through */
    case TK_LT:
    case TK_LE:
    case TK_GT:
    case TK_GE:
    case TK_NE:
    case TK_EQ: {
      Expr *pLeft = pExpr->pLeft;
      if( sqlite3ExprIsVector(pLeft) ){
        codeVectorCompare(pParse, pExpr, target, op, p5);
      }else{
        r1 = sqlite3ExprCodeTemp(pParse, pLeft, &regFree1);
        r2 = sqlite3ExprCodeTemp(pParse, pExpr->pRight, &regFree2);
        codeCompare(pParse, pLeft, pExpr->pRight, op,
            r1, r2, inReg, SQLITE_STOREP2 | p5);
        assert(TK_LT==OP_Lt); testcase(op==OP_Lt); VdbeCoverageIf(v,op==OP_Lt);
        assert(TK_LE==OP_Le); testcase(op==OP_Le); VdbeCoverageIf(v,op==OP_Le);
        assert(TK_GT==OP_Gt); testcase(op==OP_Gt); VdbeCoverageIf(v,op==OP_Gt);
        assert(TK_GE==OP_Ge); testcase(op==OP_Ge); VdbeCoverageIf(v,op==OP_Ge);
        assert(TK_EQ==OP_Eq); testcase(op==OP_Eq); VdbeCoverageIf(v,op==OP_Eq);
        assert(TK_NE==OP_Ne); testcase(op==OP_Ne); VdbeCoverageIf(v,op==OP_Ne);
        testcase( regFree1==0 );
        testcase( regFree2==0 );
      }
      break;
    }
    case TK_AND:
    case TK_OR:
    case TK_PLUS:
    case TK_STAR:
    case TK_MINUS:
    case TK_REM:
    case TK_BITAND:
    case TK_BITOR:
    case TK_SLASH:
    case TK_LSHIFT:
    case TK_RSHIFT: 
    case TK_CONCAT: {
      assert( TK_AND==OP_And );            testcase( op==TK_AND );
      assert( TK_OR==OP_Or );              testcase( op==TK_OR );
      assert( TK_PLUS==OP_Add );           testcase( op==TK_PLUS );
      assert( TK_MINUS==OP_Subtract );     testcase( op==TK_MINUS );
      assert( TK_REM==OP_Remainder );      testcase( op==TK_REM );
      assert( TK_BITAND==OP_BitAnd );      testcase( op==TK_BITAND );
      assert( TK_BITOR==OP_BitOr );        testcase( op==TK_BITOR );
      assert( TK_SLASH==OP_Divide );       testcase( op==TK_SLASH );
      assert( TK_LSHIFT==OP_ShiftLeft );   testcase( op==TK_LSHIFT );
      assert( TK_RSHIFT==OP_ShiftRight );  testcase( op==TK_RSHIFT );
      assert( TK_CONCAT==OP_Concat );      testcase( op==TK_CONCAT );
      r1 = sqlite3ExprCodeTemp(pParse, pExpr->pLeft, &regFree1);
      r2 = sqlite3ExprCodeTemp(pParse, pExpr->pRight, &regFree2);
      sqlite3VdbeAddOp3(v, op, r2, r1, target);
      testcase( regFree1==0 );
      testcase( regFree2==0 );
      break;
    }
    case TK_UMINUS: {
      Expr *pLeft = pExpr->pLeft;
      assert( pLeft );
      if( pLeft->op==TK_INTEGER ){
        codeInteger(pParse, pLeft, 1, target);
        return target;
#ifndef SQLITE_OMIT_FLOATING_POINT
      }else if( pLeft->op==TK_FLOAT ){
        assert( !ExprHasProperty(pExpr, EP_IntValue) );
        codeReal(v, pLeft->u.zToken, 1, target);
        return target;
#endif
      }else{
        tempX.op = TK_INTEGER;
        tempX.flags = EP_IntValue|EP_TokenOnly;
        tempX.u.iValue = 0;
        r1 = sqlite3ExprCodeTemp(pParse, &tempX, &regFree1);
        r2 = sqlite3ExprCodeTemp(pParse, pExpr->pLeft, &regFree2);
        sqlite3VdbeAddOp3(v, OP_Subtract, r2, r1, target);
        testcase( regFree2==0 );
      }
      break;
    }
    case TK_BITNOT:
    case TK_NOT: {
      assert( TK_BITNOT==OP_BitNot );   testcase( op==TK_BITNOT );
      assert( TK_NOT==OP_Not );         testcase( op==TK_NOT );
      r1 = sqlite3ExprCodeTemp(pParse, pExpr->pLeft, &regFree1);
      testcase( regFree1==0 );
      sqlite3VdbeAddOp2(v, op, r1, inReg);
      break;
    }
    case TK_TRUTH: {
      int isTrue;    /* IS TRUE or IS NOT TRUE */
      int bNormal;   /* IS TRUE or IS FALSE */
      r1 = sqlite3ExprCodeTemp(pParse, pExpr->pLeft, &regFree1);
      testcase( regFree1==0 );
      isTrue = sqlite3ExprTruthValue(pExpr->pRight);
      bNormal = pExpr->op2==TK_IS;
      testcase( isTrue && bNormal);
      testcase( !isTrue && bNormal);
      sqlite3VdbeAddOp4Int(v, OP_IsTrue, r1, inReg, !isTrue, isTrue ^ bNormal);
      break;
    }
    case TK_ISNULL:
    case TK_NOTNULL: {
      int addr;
      assert( TK_ISNULL==OP_IsNull );   testcase( op==TK_ISNULL );
      assert( TK_NOTNULL==OP_NotNull ); testcase( op==TK_NOTNULL );
      sqlite3VdbeAddOp2(v, OP_Integer, 1, target);
      r1 = sqlite3ExprCodeTemp(pParse, pExpr->pLeft, &regFree1);
      testcase( regFree1==0 );
      addr = sqlite3VdbeAddOp1(v, op, r1);
      VdbeCoverageIf(v, op==TK_ISNULL);
      VdbeCoverageIf(v, op==TK_NOTNULL);
      sqlite3VdbeAddOp2(v, OP_Integer, 0, target);
      sqlite3VdbeJumpHere(v, addr);
      break;
    }
    case TK_AGG_FUNCTION: {
      AggInfo *pInfo = pExpr->pAggInfo;
      if( pInfo==0 ){
        assert( !ExprHasProperty(pExpr, EP_IntValue) );
        sqlite3ErrorMsg(pParse, "misuse of aggregate: %s()", pExpr->u.zToken);
      }else{
        return pInfo->aFunc[pExpr->iAgg].iMem;
      }
      break;
    }
    case TK_FUNCTION: {
      ExprList *pFarg;       /* List of function arguments */
      int nFarg;             /* Number of function arguments */
      FuncDef *pDef;         /* The function definition object */
      const char *zId;       /* The function name */
      u32 constMask = 0;     /* Mask of function arguments that are constant */
      int i;                 /* Loop counter */
      sqlite3 *db = pParse->db;  /* The database connection */
      u8 enc = ENC(db);      /* The text encoding used by this database */
      CollSeq *pColl = 0;    /* A collating sequence */

#ifndef SQLITE_OMIT_WINDOWFUNC
      if( ExprHasProperty(pExpr, EP_WinFunc) ){
        return pExpr->y.pWin->regResult;
      }
#endif

      if( ConstFactorOk(pParse) && sqlite3ExprIsConstantNotJoin(pExpr) ){
        /* SQL functions can be expensive. So try to move constant functions
        ** out of the inner loop, even if that means an extra OP_Copy. */
        return sqlite3ExprCodeAtInit(pParse, pExpr, -1);
      }
      assert( !ExprHasProperty(pExpr, EP_xIsSelect) );
      if( ExprHasProperty(pExpr, EP_TokenOnly) ){
        pFarg = 0;
      }else{
        pFarg = pExpr->x.pList;
      }
      nFarg = pFarg ? pFarg->nExpr : 0;
      assert( !ExprHasProperty(pExpr, EP_IntValue) );
      zId = pExpr->u.zToken;
      pDef = sqlite3FindFunction(db, zId, nFarg, enc, 0);
#ifdef SQLITE_ENABLE_UNKNOWN_SQL_FUNCTION
      if( pDef==0 && pParse->explain ){
        pDef = sqlite3FindFunction(db, "unknown", nFarg, enc, 0);
      }
#endif
      if( pDef==0 || pDef->xFinalize!=0 ){
        sqlite3ErrorMsg(pParse, "unknown function: %s()", zId);
        break;
      }

      /* Attempt a direct implementation of the built-in COALESCE() and
      ** IFNULL() functions.  This avoids unnecessary evaluation of
      ** arguments past the first non-NULL argument.
      */
      if( pDef->funcFlags & SQLITE_FUNC_COALESCE ){
        int endCoalesce = sqlite3VdbeMakeLabel(pParse);
        assert( nFarg>=2 );
        sqlite3ExprCode(pParse, pFarg->a[0].pExpr, target);
        for(i=1; i<nFarg; i++){
          sqlite3VdbeAddOp2(v, OP_NotNull, target, endCoalesce);
          VdbeCoverage(v);
          sqlite3ExprCode(pParse, pFarg->a[i].pExpr, target);
        }
        sqlite3VdbeResolveLabel(v, endCoalesce);
        break;
      }

      /* The UNLIKELY() function is a no-op.  The result is the value
      ** of the first argument.
      */
      if( pDef->funcFlags & SQLITE_FUNC_UNLIKELY ){
        assert( nFarg>=1 );
        return sqlite3ExprCodeTarget(pParse, pFarg->a[0].pExpr, target);
      }

#ifdef SQLITE_DEBUG
      /* The AFFINITY() function evaluates to a string that describes
      ** the type affinity of the argument.  This is used for testing of
      ** the SQLite type logic.
      */
      if( pDef->funcFlags & SQLITE_FUNC_AFFINITY ){
        const char *azAff[] = { "blob", "text", "numeric", "integer", "real" };
        char aff;
        assert( nFarg==1 );
        aff = sqlite3ExprAffinity(pFarg->a[0].pExpr);
        sqlite3VdbeLoadString(v, target, 
                              aff ? azAff[aff-SQLITE_AFF_BLOB] : "none");
        return target;
      }
#endif

      for(i=0; i<nFarg; i++){
        if( i<32 && sqlite3ExprIsConstant(pFarg->a[i].pExpr) ){
          testcase( i==31 );
          constMask |= MASKBIT32(i);
        }
        if( (pDef->funcFlags & SQLITE_FUNC_NEEDCOLL)!=0 && !pColl ){
          pColl = sqlite3ExprCollSeq(pParse, pFarg->a[i].pExpr);
        }
      }
      if( pFarg ){
        if( constMask ){
          r1 = pParse->nMem+1;
          pParse->nMem += nFarg;
        }else{
          r1 = sqlite3GetTempRange(pParse, nFarg);
        }

        /* For length() and typeof() functions with a column argument,
        ** set the P5 parameter to the OP_Column opcode to OPFLAG_LENGTHARG
        ** or OPFLAG_TYPEOFARG respectively, to avoid unnecessary data
        ** loading.
        */
        if( (pDef->funcFlags & (SQLITE_FUNC_LENGTH|SQLITE_FUNC_TYPEOF))!=0 ){
          u8 exprOp;
          assert( nFarg==1 );
          assert( pFarg->a[0].pExpr!=0 );
          exprOp = pFarg->a[0].pExpr->op;
          if( exprOp==TK_COLUMN || exprOp==TK_AGG_COLUMN ){
            assert( SQLITE_FUNC_LENGTH==OPFLAG_LENGTHARG );
            assert( SQLITE_FUNC_TYPEOF==OPFLAG_TYPEOFARG );
            testcase( pDef->funcFlags & OPFLAG_LENGTHARG );
            pFarg->a[0].pExpr->op2 = 
                  pDef->funcFlags & (OPFLAG_LENGTHARG|OPFLAG_TYPEOFARG);
          }
        }

        sqlite3ExprCodeExprList(pParse, pFarg, r1, 0,
                                SQLITE_ECEL_DUP|SQLITE_ECEL_FACTOR);
      }else{
        r1 = 0;
      }
#ifndef SQLITE_OMIT_VIRTUALTABLE
      /* Possibly overload the function if the first argument is
      ** a virtual table column.
      **
      ** For infix functions (LIKE, GLOB, REGEXP, and MATCH) use the
      ** second argument, not the first, as the argument to test to
      ** see if it is a column in a virtual table.  This is done because
      ** the left operand of infix functions (the operand we want to
      ** control overloading) ends up as the second argument to the
      ** function.  The expression "A glob B" is equivalent to 
      ** "glob(B,A).  We want to use the A in "A glob B" to test
      ** for function overloading.  But we use the B term in "glob(B,A)".
      */
      if( nFarg>=2 && ExprHasProperty(pExpr, EP_InfixFunc) ){
        pDef = sqlite3VtabOverloadFunction(db, pDef, nFarg, pFarg->a[1].pExpr);
      }else if( nFarg>0 ){
        pDef = sqlite3VtabOverloadFunction(db, pDef, nFarg, pFarg->a[0].pExpr);
      }
#endif
      if( pDef->funcFlags & SQLITE_FUNC_NEEDCOLL ){
        if( !pColl ) pColl = db->pDfltColl; 
        sqlite3VdbeAddOp4(v, OP_CollSeq, 0, 0, 0, (char *)pColl, P4_COLLSEQ);
      }
#ifdef SQLITE_ENABLE_OFFSET_SQL_FUNC
      if( pDef->funcFlags & SQLITE_FUNC_OFFSET ){
        Expr *pArg = pFarg->a[0].pExpr;
        if( pArg->op==TK_COLUMN ){
          sqlite3VdbeAddOp3(v, OP_Offset, pArg->iTable, pArg->iColumn, target);
        }else{
          sqlite3VdbeAddOp2(v, OP_Null, 0, target);
        }
      }else
#endif
      {
        sqlite3VdbeAddOp4(v, pParse->iSelfTab ? OP_PureFunc0 : OP_Function0,
                          constMask, r1, target, (char*)pDef, P4_FUNCDEF);
        sqlite3VdbeChangeP5(v, (u8)nFarg);
      }
      if( nFarg && constMask==0 ){
        sqlite3ReleaseTempRange(pParse, r1, nFarg);
      }
      return target;
    }
#ifndef SQLITE_OMIT_SUBQUERY
    case TK_EXISTS:
    case TK_SELECT: {
      int nCol;
      testcase( op==TK_EXISTS );
      testcase( op==TK_SELECT );
      if( op==TK_SELECT && (nCol = pExpr->x.pSelect->pEList->nExpr)!=1 ){
        sqlite3SubselectError(pParse, nCol, 1);
      }else{
        return sqlite3CodeSubselect(pParse, pExpr);
      }
      break;
    }
    case TK_SELECT_COLUMN: {
      int n;
      if( pExpr->pLeft->iTable==0 ){
        pExpr->pLeft->iTable = sqlite3CodeSubselect(pParse, pExpr->pLeft);
      }
      assert( pExpr->iTable==0 || pExpr->pLeft->op==TK_SELECT );
      if( pExpr->iTable
       && pExpr->iTable!=(n = sqlite3ExprVectorSize(pExpr->pLeft)) 
      ){
        sqlite3ErrorMsg(pParse, "%d columns assigned %d values",
                                pExpr->iTable, n);
      }
      return pExpr->pLeft->iTable + pExpr->iColumn;
    }
    case TK_IN: {
      int destIfFalse = sqlite3VdbeMakeLabel(pParse);
      int destIfNull = sqlite3VdbeMakeLabel(pParse);
      sqlite3VdbeAddOp2(v, OP_Null, 0, target);
      sqlite3ExprCodeIN(pParse, pExpr, destIfFalse, destIfNull);
      sqlite3VdbeAddOp2(v, OP_Integer, 1, target);
      sqlite3VdbeResolveLabel(v, destIfFalse);
      sqlite3VdbeAddOp2(v, OP_AddImm, target, 0);
      sqlite3VdbeResolveLabel(v, destIfNull);
      return target;
    }
#endif /* SQLITE_OMIT_SUBQUERY */


    /*
    **    x BETWEEN y AND z
    **
    ** This is equivalent to
    **
    **    x>=y AND x<=z
    **
    ** X is stored in pExpr->pLeft.
    ** Y is stored in pExpr->pList->a[0].pExpr.
    ** Z is stored in pExpr->pList->a[1].pExpr.
    */
    case TK_BETWEEN: {
      exprCodeBetween(pParse, pExpr, target, 0, 0);
      return target;
    }
    case TK_SPAN:
    case TK_COLLATE: 
    case TK_UPLUS: {
      pExpr = pExpr->pLeft;
      goto expr_code_doover; /* 2018-04-28: Prevent deep recursion. OSSFuzz. */
    }

    case TK_TRIGGER: {
      /* If the opcode is TK_TRIGGER, then the expression is a reference
      ** to a column in the new.* or old.* pseudo-tables available to
      ** trigger programs. In this case Expr.iTable is set to 1 for the
      ** new.* pseudo-table, or 0 for the old.* pseudo-table. Expr.iColumn
      ** is set to the column of the pseudo-table to read, or to -1 to
      ** read the rowid field.
      **
      ** The expression is implemented using an OP_Param opcode. The p1
      ** parameter is set to 0 for an old.rowid reference, or to (i+1)
      ** to reference another column of the old.* pseudo-table, where 
      ** i is the index of the column. For a new.rowid reference, p1 is
      ** set to (n+1), where n is the number of columns in each pseudo-table.
      ** For a reference to any other column in the new.* pseudo-table, p1
      ** is set to (n+2+i), where n and i are as defined previously. For
      ** example, if the table on which triggers are being fired is
      ** declared as:
      **
      **   CREATE TABLE t1(a, b);
      **
      ** Then p1 is interpreted as follows:
      **
      **   p1==0   ->    old.rowid     p1==3   ->    new.rowid
      **   p1==1   ->    old.a         p1==4   ->    new.a
      **   p1==2   ->    old.b         p1==5   ->    new.b       
      */
      Table *pTab = pExpr->y.pTab;
      int p1 = pExpr->iTable * (pTab->nCol+1) + 1 + pExpr->iColumn;

      assert( pExpr->iTable==0 || pExpr->iTable==1 );
      assert( pExpr->iColumn>=-1 && pExpr->iColumn<pTab->nCol );
      assert( pTab->iPKey<0 || pExpr->iColumn!=pTab->iPKey );
      assert( p1>=0 && p1<(pTab->nCol*2+2) );

      sqlite3VdbeAddOp2(v, OP_Param, p1, target);
      VdbeComment((v, "r[%d]=%s.%s", target,
        (pExpr->iTable ? "new" : "old"),
        (pExpr->iColumn<0 ? "rowid" : pExpr->y.pTab->aCol[pExpr->iColumn].zName)
      ));

#ifndef SQLITE_OMIT_FLOATING_POINT
      /* If the column has REAL affinity, it may currently be stored as an
      ** integer. Use OP_RealAffinity to make sure it is really real.
      **
      ** EVIDENCE-OF: R-60985-57662 SQLite will convert the value back to
      ** floating point when extracting it from the record.  */
      if( pExpr->iColumn>=0 
       && pTab->aCol[pExpr->iColumn].affinity==SQLITE_AFF_REAL
      ){
        sqlite3VdbeAddOp1(v, OP_RealAffinity, target);
      }
#endif
      break;
    }

    case TK_VECTOR: {
      sqlite3ErrorMsg(pParse, "row value misused");
      break;
    }

    case TK_IF_NULL_ROW: {
      int addrINR;
      addrINR = sqlite3VdbeAddOp1(v, OP_IfNullRow, pExpr->iTable);
      inReg = sqlite3ExprCodeTarget(pParse, pExpr->pLeft, target);
      sqlite3VdbeJumpHere(v, addrINR);
      sqlite3VdbeChangeP3(v, addrINR, inReg);
      break;
    }

    /*
    ** Form A:
    **   CASE x WHEN e1 THEN r1 WHEN e2 THEN r2 ... WHEN eN THEN rN ELSE y END
    **
    ** Form B:
    **   CASE WHEN e1 THEN r1 WHEN e2 THEN r2 ... WHEN eN THEN rN ELSE y END
    **
    ** Form A is can be transformed into the equivalent form B as follows:
    **   CASE WHEN x=e1 THEN r1 WHEN x=e2 THEN r2 ...
    **        WHEN x=eN THEN rN ELSE y END
    **
    ** X (if it exists) is in pExpr->pLeft.
    ** Y is in the last element of pExpr->x.pList if pExpr->x.pList->nExpr is
    ** odd.  The Y is also optional.  If the number of elements in x.pList
    ** is even, then Y is omitted and the "otherwise" result is NULL.
    ** Ei is in pExpr->pList->a[i*2] and Ri is pExpr->pList->a[i*2+1].
    **
    ** The result of the expression is the Ri for the first matching Ei,
    ** or if there is no matching Ei, the ELSE term Y, or if there is
    ** no ELSE term, NULL.
    */
    default: assert( op==TK_CASE ); {
      int endLabel;                     /* GOTO label for end of CASE stmt */
      int nextCase;                     /* GOTO label for next WHEN clause */
      int nExpr;                        /* 2x number of WHEN terms */
      int i;                            /* Loop counter */
      ExprList *pEList;                 /* List of WHEN terms */
      struct ExprList_item *aListelem;  /* Array of WHEN terms */
      Expr opCompare;                   /* The X==Ei expression */
      Expr *pX;                         /* The X expression */
      Expr *pTest = 0;                  /* X==Ei (form A) or just Ei (form B) */

      assert( !ExprHasProperty(pExpr, EP_xIsSelect) && pExpr->x.pList );
      assert(pExpr->x.pList->nExpr > 0);
      pEList = pExpr->x.pList;
      aListelem = pEList->a;
      nExpr = pEList->nExpr;
      endLabel = sqlite3VdbeMakeLabel(pParse);
      if( (pX = pExpr->pLeft)!=0 ){
        exprNodeCopy(&tempX, pX);
        testcase( pX->op==TK_COLUMN );
        exprToRegister(&tempX, exprCodeVector(pParse, &tempX, &regFree1));
        testcase( regFree1==0 );
        memset(&opCompare, 0, sizeof(opCompare));
        opCompare.op = TK_EQ;
        opCompare.pLeft = &tempX;
        pTest = &opCompare;
        /* Ticket b351d95f9cd5ef17e9d9dbae18f5ca8611190001:
        ** The value in regFree1 might get SCopy-ed into the file result.
        ** So make sure that the regFree1 register is not reused for other
        ** purposes and possibly overwritten.  */
        regFree1 = 0;
      }
      for(i=0; i<nExpr-1; i=i+2){
        if( pX ){
          assert( pTest!=0 );
          opCompare.pRight = aListelem[i].pExpr;
        }else{
          pTest = aListelem[i].pExpr;
        }
        nextCase = sqlite3VdbeMakeLabel(pParse);
        testcase( pTest->op==TK_COLUMN );
        sqlite3ExprIfFalse(pParse, pTest, nextCase, SQLITE_JUMPIFNULL);
        testcase( aListelem[i+1].pExpr->op==TK_COLUMN );
        sqlite3ExprCode(pParse, aListelem[i+1].pExpr, target);
        sqlite3VdbeGoto(v, endLabel);
        sqlite3VdbeResolveLabel(v, nextCase);
      }
      if( (nExpr&1)!=0 ){
        sqlite3ExprCode(pParse, pEList->a[nExpr-1].pExpr, target);
      }else{
        sqlite3VdbeAddOp2(v, OP_Null, 0, target);
      }
      sqlite3VdbeResolveLabel(v, endLabel);
      break;
    }
#ifndef SQLITE_OMIT_TRIGGER
    case TK_RAISE: {
      assert( pExpr->affinity==OE_Rollback 
           || pExpr->affinity==OE_Abort
           || pExpr->affinity==OE_Fail
           || pExpr->affinity==OE_Ignore
      );
      if( !pParse->pTriggerTab ){
        sqlite3ErrorMsg(pParse,
                       "RAISE() may only be used within a trigger-program");
        return 0;
      }
      if( pExpr->affinity==OE_Abort ){
        sqlite3MayAbort(pParse);
      }
      assert( !ExprHasProperty(pExpr, EP_IntValue) );
      if( pExpr->affinity==OE_Ignore ){
        sqlite3VdbeAddOp4(
            v, OP_Halt, SQLITE_OK, OE_Ignore, 0, pExpr->u.zToken,0);
        VdbeCoverage(v);
      }else{
        sqlite3HaltConstraint(pParse, SQLITE_CONSTRAINT_TRIGGER,
                              pExpr->affinity, pExpr->u.zToken, 0, 0);
      }

      break;
    }
#endif
  }
  sqlite3ReleaseTempReg(pParse, regFree1);
  sqlite3ReleaseTempReg(pParse, regFree2);
  return inReg;
}